

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::DefaultFBOMultisampleCase::DefaultFBOMultisampleCase
          (DefaultFBOMultisampleCase *this,Context *context,char *name,char *desc,
          int desiredViewportSize)

{
  deUint32 seed;
  
  TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DefaultFBOMultisampleCase_00a14ce0;
  this->m_numSamples = 0;
  this->m_viewportSize = 0;
  this->m_desiredViewportSize = desiredViewportSize;
  this->m_program = (ShaderProgram *)0x0;
  this->m_attrPositionLoc = -1;
  this->m_attrColorLoc = -1;
  this->m_viewportX = 0;
  this->m_viewportY = 0;
  seed = deStringHash(name);
  deRandom_init(&(this->m_rnd).m_rnd,seed);
  this->m_initCalled = false;
  return;
}

Assistant:

DefaultFBOMultisampleCase::DefaultFBOMultisampleCase (Context& context, const char* name, const char* desc, int desiredViewportSize)
	: TestCase				(context, name, desc)
	, m_numSamples			(0)
	, m_viewportSize		(0)
	, m_desiredViewportSize	(desiredViewportSize)
	, m_program				(DE_NULL)
	, m_attrPositionLoc		(-1)
	, m_attrColorLoc		(-1)
	, m_viewportX			(0)
	, m_viewportY			(0)
	, m_rnd					(deStringHash(name))
	, m_initCalled			(false)
{
}